

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O1

void __thiscall zmq::session_base_t::write_activated(session_base_t *this,pipe_t *pipe_)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  if (this->_pipe == pipe_) {
    if (this->_engine != (i_engine *)0x0) {
      (*this->_engine->_vptr_i_engine[5])();
      return;
    }
  }
  else {
    p_Var3 = &(this->_terminating_pipes)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->_terminating_pipes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &p_Var3->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(pipe_t **)(p_Var2 + 1) < pipe_])
    {
      if (*(pipe_t **)(p_Var2 + 1) >= pipe_) {
        p_Var1 = p_Var2;
      }
    }
    p_Var2 = &p_Var3->_M_header;
    if (((_Rb_tree_header *)p_Var1 != p_Var3) && (p_Var2 = p_Var1, pipe_ < *(pipe_t **)(p_Var1 + 1))
       ) {
      p_Var2 = &p_Var3->_M_header;
    }
    if ((_Rb_tree_header *)p_Var2 == p_Var3) {
      write_activated();
    }
  }
  return;
}

Assistant:

void zmq::session_base_t::write_activated (pipe_t *pipe_)
{
    // Skip activating if we're detaching this pipe
    if (_pipe != pipe_) {
        zmq_assert (_terminating_pipes.count (pipe_) == 1);
        return;
    }

    if (_engine)
        _engine->restart_input ();
}